

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseClass
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  size_t *this_00;
  Capabilities *__args_1;
  bool bVar1;
  Token *pTVar2;
  Position *__args_2;
  Token **in_RDX;
  unique_ptr<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_> local_e0;
  undefined1 local_d8 [8];
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  functions;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  attrs;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_a0;
  undefined1 local_98 [16];
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  constructAttributes;
  undefined1 local_68 [16];
  Token *tokId;
  TemplateDecls templ;
  bool err;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Parser *this_local;
  
  sanityExpect((Parser *)caps,TOK_KW_CLASS);
  pTVar2 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar1 = Token::operator==(pTVar2,TOK_KW_TRAIT);
  if (bVar1) {
    parseClassTrait(this,caps);
  }
  else {
    templ.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
              *)&stack0xffffffffffffffc0);
    pTVar2 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    bVar1 = Token::operator==(pTVar2,TOK_OP_TEMPL_BRACKET_OPEN);
    if (bVar1) {
      parseTemplateDecl((TemplateDecls *)&tokId,(Parser *)caps);
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::operator=((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                   *)&stack0xffffffffffffffc0,
                  (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                   *)&tokId);
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 *)&tokId);
      templ.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    local_68._8_8_ =
         Lexer::getCurrentToken
                   ((Lexer *)(caps->_M_t).
                             super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                             .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    bVar1 = expect((Parser *)caps,TOK_ID);
    if (!bVar1) {
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node._M_size._6_2_ = 2;
      constructAttributes.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node._M_size._0_4_ = 8;
      Token::getPosition((Token *)local_68._8_8_);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&stack0xffffffffffffff90,
                 (SyntaxErrorCode *)
                 ((long)&constructAttributes.
                         super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                         ._M_impl._M_node._M_size + 6),
                 (Position *)
                 &constructAttributes.
                  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                  ._M_impl._M_node._M_size);
      generateError((Parser *)local_68,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_68);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&stack0xffffffffffffff90);
      templ.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    std::__cxx11::
    list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::list((list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
            *)(local_98 + 8));
    pTVar2 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    bVar1 = Token::operator==(pTVar2,TOK_OP_BRACKET_OPEN);
    if (bVar1) {
      parseClassConstructor
                ((Parser *)caps,
                 (bool *)((long)&templ.
                                 super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                 (list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                  *)(local_98 + 8));
    }
    bVar1 = expect((Parser *)caps,TOK_EOL);
    if (!bVar1) {
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node._M_size._6_2_ = 2;
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node._M_size._0_4_ = 0xf;
      pTVar2 = Lexer::getCurrentToken
                         ((Lexer *)(caps->_M_t).
                                   super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                   .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                   _M_head_impl);
      Token::getPosition(pTVar2);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&local_a0,
                 (SyntaxErrorCode *)
                 ((long)&attrs.
                         super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                         ._M_impl._M_node._M_size + 6),
                 (Position *)
                 &attrs.
                  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                  ._M_impl._M_node._M_size);
      generateError((Parser *)local_98,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_98);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr(&local_a0);
    }
    this_00 = &functions.
               super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
               ._M_impl._M_node._M_size;
    std::__cxx11::
    list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::list((list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
            *)this_00);
    std::__cxx11::
    list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ::list((list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
            *)local_d8);
    parseClassBody((Parser *)caps,(Token *)local_68._8_8_,
                   (bool *)((long)&templ.
                                   super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                   (list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                    *)this_00,
                   (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                    *)local_d8);
    __args_1 = (caps->_M_t).
               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
    __args_2 = Token::getPosition((Token *)local_68._8_8_);
    std::
    make_unique<pfederc::ClassExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*const&,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>,std::__cxx11::list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>,std::__cxx11::list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>,std::__cxx11::list<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>,std::allocator<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>>>>
              ((Lexer *)&local_e0,(Position *)__args_1,
               (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
               __args_2,in_RDX,
               (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                *)(local_68 + 8),
               (list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                *)&stack0xffffffffffffffc0,
               (list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                *)(local_98 + 8),
               (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                *)this_00);
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<pfederc::ClassExpr,std::default_delete<pfederc::ClassExpr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,&local_e0);
    std::unique_ptr<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_>::~unique_ptr
              (&local_e0);
    std::__cxx11::
    list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ::~list((list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
             *)local_d8);
    std::__cxx11::
    list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::~list((list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
             *)&functions.
                super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                ._M_impl._M_node._M_size);
    std::__cxx11::
    list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::~list((list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
             *)(local_98 + 8));
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
               *)&stack0xffffffffffffffc0);
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseClass(std::unique_ptr<Capabilities> &&caps) noexcept {
  sanityExpect(TokenType::TOK_KW_CLASS);
  // maybe it's a class trait
  if (*lexer.getCurrentToken() == TokenType::TOK_KW_TRAIT)
    return parseClassTrait(std::move(caps));

  bool err = false;

  // class templ?
  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
    err = true;
  }

  // class templ? id
  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokId->getPosition()));
    err = true;
  }

  std::list<std::unique_ptr<BiOpExpr>> constructAttributes;
  // class templ? id constructor?
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
    parseClassConstructor(err, constructAttributes);
  }
  // class templ? id constructor? newline
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::list<std::unique_ptr<BiOpExpr>> attrs;
  std::list<std::unique_ptr<FuncExpr>> functions;
	parseClassBody(tokId, err, attrs, functions);

  return std::make_unique<ClassExpr>(lexer, tokId->getPosition(), std::move(caps),
    tokId, std::move(templ), std::move(constructAttributes),
    std::move(attrs), std::move(functions));
}